

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O2

void __thiscall cmCPackIFWInstaller::ConfigureFromOptions(cmCPackIFWInstaller *this)

{
  bool bVar1;
  char *pcVar2;
  pointer s;
  string prefix;
  RepositoryStruct Repo;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  RepoAllVector;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  value_type local_110;
  vector<cmCPackIFWInstaller::RepositoryStruct,_std::allocator<cmCPackIFWInstaller::RepositoryStruct>_>
  *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  std::__cxx11::string::string
            ((string *)&local_110,"CPACK_IFW_PACKAGE_NAME",(allocator *)&local_150);
  pcVar2 = GetOption(this,&local_110.Url);
  std::__cxx11::string::~string((string *)&local_110);
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_110,"CPACK_PACKAGE_NAME",(allocator *)&local_150);
    GetOption(this,&local_110.Url);
    std::__cxx11::string::~string((string *)&local_110);
  }
  std::__cxx11::string::assign((char *)this);
  std::__cxx11::string::string
            ((string *)&local_110,"CPACK_IFW_PACKAGE_TITLE",(allocator *)&local_150);
  pcVar2 = GetOption(this,&local_110.Url);
  std::__cxx11::string::~string((string *)&local_110);
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_110,"CPACK_PACKAGE_DESCRIPTION_SUMMARY",(allocator *)&local_150);
    GetOption(this,&local_110.Url);
    std::__cxx11::string::~string((string *)&local_110);
  }
  std::__cxx11::string::assign((char *)&this->Title);
  std::__cxx11::string::string((string *)&local_110,"CPACK_PACKAGE_VERSION",(allocator *)&local_150)
  ;
  GetOption(this,&local_110.Url);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::assign((char *)&this->Version);
  std::__cxx11::string::string
            ((string *)&local_110,"CPACK_IFW_PACKAGE_PUBLISHER",(allocator *)&local_150);
  pcVar2 = GetOption(this,&local_110.Url);
  std::__cxx11::string::~string((string *)&local_110);
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_110,"CPACK_PACKAGE_VENDOR",(allocator *)&local_150);
    pcVar2 = GetOption(this,&local_110.Url);
    std::__cxx11::string::~string((string *)&local_110);
    if (pcVar2 != (char *)0x0) goto LAB_0029dfdf;
  }
  else {
LAB_0029dfdf:
    std::__cxx11::string::assign((char *)&this->Publisher);
  }
  std::__cxx11::string::string((string *)&local_110,"CPACK_IFW_PRODUCT_URL",(allocator *)&local_150)
  ;
  pcVar2 = GetOption(this,&local_110.Url);
  std::__cxx11::string::~string((string *)&local_110);
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::assign((char *)&this->ProductUrl);
  }
  std::__cxx11::string::string
            ((string *)&local_110,"CPACK_IFW_PACKAGE_ICON",(allocator *)&local_150);
  pcVar2 = GetOption(this,&local_110.Url);
  std::__cxx11::string::~string((string *)&local_110);
  if ((pcVar2 != (char *)0x0) && (bVar1 = cmsys::SystemTools::FileExists(pcVar2), bVar1)) {
    std::__cxx11::string::assign((char *)&this->InstallerApplicationIcon);
  }
  std::__cxx11::string::string
            ((string *)&local_110,"CPACK_IFW_PACKAGE_WINDOW_ICON",(allocator *)&local_150);
  pcVar2 = GetOption(this,&local_110.Url);
  std::__cxx11::string::~string((string *)&local_110);
  if ((pcVar2 != (char *)0x0) && (bVar1 = cmsys::SystemTools::FileExists(pcVar2), bVar1)) {
    std::__cxx11::string::assign((char *)&this->InstallerWindowIcon);
  }
  std::__cxx11::string::string
            ((string *)&local_110,"CPACK_IFW_PACKAGE_LOGO",(allocator *)&local_150);
  pcVar2 = GetOption(this,&local_110.Url);
  std::__cxx11::string::~string((string *)&local_110);
  if ((pcVar2 != (char *)0x0) && (bVar1 = cmsys::SystemTools::FileExists(pcVar2), bVar1)) {
    std::__cxx11::string::assign((char *)&this->Logo);
  }
  std::__cxx11::string::string
            ((string *)&local_110,"CPACK_IFW_PACKAGE_START_MENU_DIRECTORY",(allocator *)&local_150);
  pcVar2 = GetOption(this,&local_110.Url);
  std::__cxx11::string::~string((string *)&local_110);
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::_M_assign((string *)&this->StartMenuDir);
  }
  else {
    std::__cxx11::string::assign((char *)&this->StartMenuDir);
  }
  std::__cxx11::string::string
            ((string *)&local_110,"CPACK_IFW_TARGET_DIRECTORY",(allocator *)&local_150);
  pcVar2 = GetOption(this,&local_110.Url);
  std::__cxx11::string::~string((string *)&local_110);
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_110,"CPACK_PACKAGE_INSTALL_DIRECTORY",(allocator *)&local_150);
    pcVar2 = GetOption(this,&local_110.Url);
    std::__cxx11::string::~string((string *)&local_110);
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&this->TargetDir);
      std::__cxx11::string::append((char *)&this->TargetDir);
      goto LAB_0029e20d;
    }
  }
  std::__cxx11::string::assign((char *)&this->TargetDir);
LAB_0029e20d:
  std::__cxx11::string::string
            ((string *)&local_110,"CPACK_IFW_ADMIN_TARGET_DIRECTORY",(allocator *)&local_150);
  pcVar2 = GetOption(this,&local_110.Url);
  std::__cxx11::string::~string((string *)&local_110);
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::assign((char *)&this->AdminTargetDir);
  }
  local_70 = &this->Repositories;
  std::
  vector<cmCPackIFWInstaller::RepositoryStruct,_std::allocator<cmCPackIFWInstaller::RepositoryStruct>_>
  ::clear(local_70);
  local_110.Url._M_dataplus._M_p = (pointer)&local_110.Url.field_2;
  local_110.Url._M_string_length = 0;
  local_110.Url.field_2._M_local_buf[0] = '\0';
  local_110.Enabled._M_dataplus._M_p = (pointer)&local_110.Enabled.field_2;
  local_110.Enabled._M_string_length = 0;
  local_110.Enabled.field_2._M_local_buf[0] = '\0';
  local_110.Username._M_dataplus._M_p = (pointer)&local_110.Username.field_2;
  local_110.Username._M_string_length = 0;
  local_110.Username.field_2._M_local_buf[0] = '\0';
  local_110.Password._M_dataplus._M_p = (pointer)&local_110.Password.field_2;
  local_110.Password._M_string_length = 0;
  local_110.Password.field_2._M_local_buf[0] = '\0';
  local_110.DisplayName._M_dataplus._M_p = (pointer)&local_110.DisplayName.field_2;
  local_110.DisplayName._M_string_length = 0;
  local_110.DisplayName.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_150,"CPACK_DOWNLOAD_SITE",(allocator *)&local_130);
  pcVar2 = GetOption(this,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::assign((char *)&local_110);
    std::
    vector<cmCPackIFWInstaller::RepositoryStruct,_std::allocator<cmCPackIFWInstaller::RepositoryStruct>_>
    ::push_back(local_70,&local_110);
  }
  std::__cxx11::string::string
            ((string *)&local_150,"CPACK_IFW_REPOSITORIES_ALL",(allocator *)&local_130);
  pcVar2 = GetOption(this,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  if (pcVar2 != (char *)0x0) {
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_150,pcVar2,(allocator *)&local_130);
    cmSystemTools::ExpandListArgument(&local_150,&local_68,false);
    std::__cxx11::string::~string((string *)&local_150);
    for (s = local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        s != local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; s = s + 1) {
      cmsys::SystemTools::UpperCase(&local_50,s);
      std::operator+(&local_130,"CPACK_IFW_REPOSITORY_",&local_50);
      std::operator+(&local_150,&local_130,"_");
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_50);
      std::operator+(&local_130,&local_150,"URL");
      GetOption(this,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::assign((char *)&local_110);
      std::operator+(&local_130,&local_150,"DISABLED");
      IsOn(this,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::assign((char *)&local_110.Enabled);
      std::operator+(&local_130,&local_150,"USERNAME");
      GetOption(this,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::assign((char *)&local_110.Username);
      std::operator+(&local_130,&local_150,"PASSWORD");
      GetOption(this,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::assign((char *)&local_110.Password);
      std::operator+(&local_130,&local_150,"DISPLAY_NAME");
      GetOption(this,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::assign((char *)&local_110.DisplayName);
      if (local_110.Url._M_string_length != 0) {
        std::
        vector<cmCPackIFWInstaller::RepositoryStruct,_std::allocator<cmCPackIFWInstaller::RepositoryStruct>_>
        ::push_back(local_70,&local_110);
      }
      std::__cxx11::string::~string((string *)&local_150);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
  }
  std::__cxx11::string::string
            ((string *)&local_150,"CPACK_IFW_PACKAGE_MAINTENANCE_TOOL_NAME",(allocator *)&local_130)
  ;
  pcVar2 = GetOption(this,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::assign((char *)&this->MaintenanceToolName);
  }
  std::__cxx11::string::string
            ((string *)&local_150,"CPACK_IFW_PACKAGE_MAINTENANCE_TOOL_INI_FILE",
             (allocator *)&local_130);
  pcVar2 = GetOption(this,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::assign((char *)&this->MaintenanceToolIniFile);
  }
  std::__cxx11::string::string
            ((string *)&local_150,"CPACK_IFW_PACKAGE_ALLOW_NON_ASCII_CHARACTERS",
             (allocator *)&local_130);
  pcVar2 = GetOption(this,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_150,"CPACK_IFW_PACKAGE_ALLOW_NON_ASCII_CHARACTERS",
               (allocator *)&local_130);
    IsOn(this,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::assign((char *)&this->AllowNonAsciiCharacters);
  }
  std::__cxx11::string::string
            ((string *)&local_150,"CPACK_IFW_PACKAGE_ALLOW_SPACE_IN_PATH",(allocator *)&local_130);
  pcVar2 = GetOption(this,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_150,"CPACK_IFW_PACKAGE_ALLOW_SPACE_IN_PATH",(allocator *)&local_130)
    ;
    IsOn(this,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::assign((char *)&this->AllowSpaceInPath);
  }
  std::__cxx11::string::string
            ((string *)&local_150,"CPACK_IFW_PACKAGE_CONTROL_SCRIPT",(allocator *)&local_130);
  pcVar2 = GetOption(this,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::assign((char *)&this->ControlScript);
  }
  RepositoryStruct::~RepositoryStruct(&local_110);
  return;
}

Assistant:

void cmCPackIFWInstaller::ConfigureFromOptions()
{
  // Name;
  if (const char* optIFW_PACKAGE_NAME =
      this->GetOption("CPACK_IFW_PACKAGE_NAME"))
    {
    Name = optIFW_PACKAGE_NAME;
    }
  else if (const char* optPACKAGE_NAME =
           this->GetOption("CPACK_PACKAGE_NAME"))
    {
    Name = optPACKAGE_NAME;
    }
  else
    {
    Name = "Your package";
    }

  // Title;
  if (const char* optIFW_PACKAGE_TITLE =
      GetOption("CPACK_IFW_PACKAGE_TITLE"))
    {
    Title = optIFW_PACKAGE_TITLE;
    }
  else if (const char* optPACKAGE_DESCRIPTION_SUMMARY =
           GetOption("CPACK_PACKAGE_DESCRIPTION_SUMMARY"))
    {
    Title = optPACKAGE_DESCRIPTION_SUMMARY;
    }
  else
    {
    Title = "Your package description";
    }

  // Version;
  if (const char* option = GetOption("CPACK_PACKAGE_VERSION"))
    {
    Version = option;
    }
  else
    {
    Version = "1.0.0";
    }

  // Publisher
  if(const char* optIFW_PACKAGE_PUBLISHER =
     GetOption("CPACK_IFW_PACKAGE_PUBLISHER"))
    {
    Publisher = optIFW_PACKAGE_PUBLISHER;
    }
  else if(const char* optPACKAGE_VENDOR = GetOption("CPACK_PACKAGE_VENDOR"))
    {
    Publisher = optPACKAGE_VENDOR;
    }

  // ProductUrl
  if(const char* option = GetOption("CPACK_IFW_PRODUCT_URL"))
    {
    ProductUrl = option;
    }

  // ApplicationIcon
  if(const char* option = GetOption("CPACK_IFW_PACKAGE_ICON"))
    {
    if(cmSystemTools::FileExists(option))
      {
      InstallerApplicationIcon = option;
      }
    else
      {
      // TODO: implement warning
      }
    }

  // WindowIcon
  if(const char* option = GetOption("CPACK_IFW_PACKAGE_WINDOW_ICON"))
    {
    if(cmSystemTools::FileExists(option))
      {
      InstallerWindowIcon = option;
      }
    else
      {
      // TODO: implement warning
      }
    }

  // Logo
  if(const char* option = GetOption("CPACK_IFW_PACKAGE_LOGO"))
    {
    if(cmSystemTools::FileExists(option))
      {
      Logo = option;
      }
    else
      {
      // TODO: implement warning
      }
    }

  // Start menu
  if (const char* optIFW_START_MENU_DIR =
      this->GetOption("CPACK_IFW_PACKAGE_START_MENU_DIRECTORY"))
    {
    StartMenuDir = optIFW_START_MENU_DIR;
    }
  else
    {
    StartMenuDir = Name;
    }

  // Default target directory for installation
  if (const char* optIFW_TARGET_DIRECTORY =
      GetOption("CPACK_IFW_TARGET_DIRECTORY"))
    {
    TargetDir = optIFW_TARGET_DIRECTORY;
    }
  else if (const char *optPACKAGE_INSTALL_DIRECTORY =
           GetOption("CPACK_PACKAGE_INSTALL_DIRECTORY"))
    {
    TargetDir = "@ApplicationsDir@/";
    TargetDir += optPACKAGE_INSTALL_DIRECTORY;
    }
  else
    {
    TargetDir = "@RootDir@/usr/local";
    }

  // Default target directory for installation with administrator rights
  if (const char* option = GetOption("CPACK_IFW_ADMIN_TARGET_DIRECTORY"))
    {
    AdminTargetDir = option;
    }

  // Repositories
  Repositories.clear();
  RepositoryStruct Repo;
  if(const char *site = this->GetOption("CPACK_DOWNLOAD_SITE"))
    {
    Repo.Url = site;
    Repositories.push_back(Repo);
    }
  if(const char *RepoAllStr = this->GetOption("CPACK_IFW_REPOSITORIES_ALL"))
    {
    std::vector<std::string> RepoAllVector;
    cmSystemTools::ExpandListArgument(RepoAllStr,
                                      RepoAllVector);
    for(std::vector<std::string>::iterator
          rit = RepoAllVector.begin(); rit != RepoAllVector.end(); ++rit)
      {
        std::string prefix = "CPACK_IFW_REPOSITORY_"
          + cmsys::SystemTools::UpperCase(*rit)
          + "_";
        // Url
        if (const char* url = GetOption(prefix + "URL"))
          {
          Repo.Url = url;
          }
        else
          {
          Repo.Url = "";
          }
        // Enabled
        if (IsOn(prefix + "DISABLED"))
          {
          Repo.Enabled = "0";
          }
        else
          {
          Repo.Enabled = "";
          }
        // Username
        if (const char* username = GetOption(prefix + "USERNAME"))
          {
          Repo.Username = username;
          }
        else
          {
          Repo.Username = "";
          }
        // Password
        if (const char* password = GetOption(prefix + "PASSWORD"))
          {
          Repo.Password = password;
          }
        else
          {
          Repo.Password = "";
          }
        // DisplayName
        if (const char* displayName = GetOption(prefix + "DISPLAY_NAME"))
          {
          Repo.DisplayName = displayName;
          }
        else
          {
          Repo.DisplayName = "";
          }

        if(!Repo.Url.empty())
          {
          Repositories.push_back(Repo);
          }
      }
    }

  // Maintenance tool
  if(const char* optIFW_MAINTENANCE_TOOL =
      this->GetOption("CPACK_IFW_PACKAGE_MAINTENANCE_TOOL_NAME"))
    {
    MaintenanceToolName = optIFW_MAINTENANCE_TOOL;
    }

  // Maintenance tool ini file
  if(const char* optIFW_MAINTENANCE_TOOL_INI =
      this->GetOption("CPACK_IFW_PACKAGE_MAINTENANCE_TOOL_INI_FILE"))
    {
    MaintenanceToolIniFile = optIFW_MAINTENANCE_TOOL_INI;
    }

  // Allow non-ASCII characters
  if(this->GetOption("CPACK_IFW_PACKAGE_ALLOW_NON_ASCII_CHARACTERS"))
    {
    if(IsOn("CPACK_IFW_PACKAGE_ALLOW_NON_ASCII_CHARACTERS"))
      {
      AllowNonAsciiCharacters = "true";
      }
    else
      {
      AllowNonAsciiCharacters = "false";
      }
    }

  // Space in path
  if(this->GetOption("CPACK_IFW_PACKAGE_ALLOW_SPACE_IN_PATH"))
    {
    if(IsOn("CPACK_IFW_PACKAGE_ALLOW_SPACE_IN_PATH"))
      {
      AllowSpaceInPath = "true";
      }
    else
      {
      AllowSpaceInPath = "false";
      }
    }

  // Control script
  if(const char* optIFW_CONTROL_SCRIPT =
      this->GetOption("CPACK_IFW_PACKAGE_CONTROL_SCRIPT"))
    {
    ControlScript = optIFW_CONTROL_SCRIPT;
    }
}